

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_io_nextStandardAliases
                 (UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  size_t sVar6;
  ulong uVar7;
  uint16_t *unaff_R14;
  
  puVar5 = gMainTable.stringTable;
  puVar4 = gMainTable.taggedAliasLists;
  puVar3 = (uint *)enumerator->context;
  uVar7 = (ulong)*puVar3;
  if (uVar7 != 0) {
    uVar1 = gMainTable.taggedAliasLists[uVar7];
    uVar2 = puVar3[1];
    if (uVar2 < uVar1) {
      puVar3[1] = uVar2 + 1;
      unaff_R14 = puVar5 + puVar4[uVar7 + (ulong)uVar2 + 1];
      if (resultLength != (int32_t *)0x0) {
        sVar6 = strlen((char *)unaff_R14);
        *resultLength = (int32_t)sVar6;
      }
    }
    if (uVar2 < uVar1) {
      return (char *)unaff_R14;
    }
  }
  if (resultLength != (int32_t *)0x0) {
    *resultLength = 0;
  }
  return (char *)0x0;
}

Assistant:

static const char * U_CALLCONV
ucnv_io_nextStandardAliases(UEnumeration *enumerator,
                            int32_t* resultLength,
                            UErrorCode * /*pErrorCode*/)
{
    UAliasContext *myContext = (UAliasContext *)(enumerator->context);
    uint32_t listOffset = myContext->listOffset;

    if (listOffset) {
        uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
        const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

        if (myContext->listIdx < listCount) {
            const char *myStr = GET_STRING(currList[myContext->listIdx++]);
            if (resultLength) {
                *resultLength = (int32_t)uprv_strlen(myStr);
            }
            return myStr;
        }
    }
    /* Either we accessed a zero length list, or we enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}